

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::DoubleAPFloat::DoubleAPFloat(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  bool bVar1;
  undefined8 *puVar2;
  type pAVar3;
  APFloat *local_30;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  this->Semantics = RHS->Semantics;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&RHS->Floats);
  if (bVar1) {
    puVar2 = (undefined8 *)operator_new__(0x48);
    *puVar2 = 2;
    local_30 = (APFloat *)(puVar2 + 1);
    pAVar3 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&RHS->Floats,0);
    APFloat::APFloat(local_30,pAVar3);
    pAVar3 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&RHS->Floats,1);
    APFloat::APFloat((APFloat *)(puVar2 + 5),pAVar3);
  }
  else {
    local_30 = (APFloat *)0x0;
  }
  std::unique_ptr<llvm::APFloat[],std::default_delete<llvm::APFloat[]>>::
  unique_ptr<llvm::APFloat*,std::default_delete<llvm::APFloat[]>,void,bool>
            ((unique_ptr<llvm::APFloat[],std::default_delete<llvm::APFloat[]>> *)&this->Floats,
             local_30);
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf32,"llvm::detail::DoubleAPFloat::DoubleAPFloat(const DoubleAPFloat &)");
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const DoubleAPFloat &RHS)
    : Semantics(RHS.Semantics),
      Floats(RHS.Floats ? new APFloat[2]{APFloat(RHS.Floats[0]),
                                         APFloat(RHS.Floats[1])}
                        : nullptr) {
  assert(Semantics == &semPPCDoubleDouble);
}